

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigrecord.hh
# Opt level: O2

void avro::codec_traits<testgen::_bigrecord_Union__1__>::decode(Decoder *d,_bigrecord_Union__1__ *v)

{
  ulong uVar1;
  Exception *this;
  allocator<char> local_39;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vv;
  
  uVar1 = (**(code **)(*(long *)d + 0xb0))();
  if (1 < uVar1) {
    this = (Exception *)__cxa_allocate_exception(0x18);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&vv,"Union index too big",&local_39);
    Exception::Exception(this,(string *)&vv);
    __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
  }
  if ((uVar1 & 1) != 0) {
    (**(code **)(*(long *)d + 0x18))(d);
    testgen::_bigrecord_Union__1__::set_null(v);
    return;
  }
  vv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (**(code **)(*(long *)d + 0x58))(d);
  testgen::_bigrecord_Union__1__::set_bytes(v,&vv);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&vv.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

static void decode(Decoder& d, testgen::_bigrecord_Union__1__& v) {
        size_t n = d.decodeUnionIndex();
        if (n >= 2) { throw avro::Exception("Union index too big"); }
        switch (n) {
        case 0:
            {
                std::vector<uint8_t> vv;
                avro::decode(d, vv);
                v.set_bytes(vv);
            }
            break;
        case 1:
            d.decodeNull();
            v.set_null();
            break;
        }
    }